

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall
QWidgetPrivate::render
          (QWidgetPrivate *this,QPaintDevice *target,QPoint *targetOffset,QRegion *sourceRegion,
          RenderFlags renderFlags)

{
  bool bVar1;
  int iVar2;
  Int IVar3;
  ulong uVar4;
  pointer pQVar5;
  QPainter *pQVar6;
  long lVar7;
  QRegion *in_RCX;
  undefined8 *in_RDX;
  QWidgetPrivate *in_RSI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  QPainter *in_stack_00000010;
  QPoint *in_stack_00000018;
  QRegion *in_stack_00000020;
  QPaintDevice *in_stack_00000028;
  QWidgetPrivate *in_stack_00000030;
  QPaintEngine *targetEngine;
  QPaintDevice *redirected;
  QPainter *targetPainter;
  QWidgetPrivate *targetPrivate;
  QPainter *oldSharedPainter;
  bool inRenderWithPainter;
  DrawWidgetFlags flags;
  QRegion targetSystemClip;
  QPoint redirectionOffset;
  QPoint offset;
  QRegion paintRegion;
  QFlagsStorage<QWidgetPrivate::DrawWidgetFlag> in_stack_0000029c;
  QWidgetRepaintManager *in_stack_000002d0;
  QRect *in_stack_fffffffffffffed8;
  RenderFlag other;
  QPoint *in_stack_fffffffffffffee0;
  QPoint *in_stack_fffffffffffffee8;
  QWidgetPrivate *in_stack_fffffffffffffef0;
  uint *in_stack_fffffffffffffef8;
  QPainter *local_f8;
  bool local_e9;
  QWidgetPrivate *local_d8;
  QRegion *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  uint uVar8;
  QWidgetPrivate *local_a0;
  QFlagsStorageHelper<QWidget::RenderFlag,_4> local_8c;
  QFlagsStorageHelper<QWidget::RenderFlag,_4> local_88;
  QFlagsStorage<QWidgetPrivate::DrawWidgetFlag> local_84;
  QPoint local_80;
  undefined1 local_78 [4];
  QFlagsStorage<QWidget::RenderFlag> in_stack_ffffffffffffff8c;
  QRegion local_70;
  undefined1 *local_64;
  undefined1 local_5c [16];
  QPoint local_4c;
  undefined8 local_44;
  undefined4 local_3c;
  QRegion local_38;
  char local_30 [36];
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI == (QWidgetPrivate *)0x0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8,
               (int)((ulong)in_stack_fffffffffffffee0 >> 0x20),(char *)in_stack_fffffffffffffed8);
    QMessageLogger::warning(local_30,"QWidget::render: null pointer to paint device");
  }
  else {
    local_c = in_R8D;
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36f085);
    local_e9 = false;
    if (bVar1) {
      pQVar5 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                         ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36f0a2);
      local_e9 = (*(ushort *)&pQVar5->field_0x7c >> 6 & 1) != 0;
    }
    uVar8 = CONCAT13(local_e9,(int3)in_stack_ffffffffffffff4c);
    local_38.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    if (local_e9 == false) {
      local_3c = local_c;
      prepareToRender((QWidgetPrivate *)CONCAT44(uVar8,in_stack_ffffffffffffff48),
                      in_stack_ffffffffffffff40,(RenderFlags)in_stack_ffffffffffffff8c.i);
    }
    else {
      QRegion::QRegion(&local_38,in_RCX);
    }
    uVar4 = QRegion::isEmpty();
    if ((uVar4 & 1) == 0) {
      if ((uVar8 & 0x1000000) == 0) {
        local_f8 = (QPainter *)0x0;
      }
      else {
        local_f8 = sharedPainter(in_stack_fffffffffffffef0);
      }
      iVar2 = (**(code **)(*(long *)in_RSI + 0x10))();
      if (iVar2 == 1) {
        if (in_RSI == (QWidgetPrivate *)0x0) {
          in_stack_fffffffffffffef8 = (uint *)0x0;
        }
        else {
          in_stack_fffffffffffffef8 = in_RSI[-1].high_attributes + 2;
        }
        QWidget::d_func((QWidget *)0x36f1b3);
        bVar1 = std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36f1c6);
        if ((((bVar1) &&
             (pQVar5 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                                 ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36f1da),
             (*(ushort *)&pQVar5->field_0x7c >> 6 & 1) != 0)) &&
            (pQVar6 = sharedPainter(in_stack_fffffffffffffef0), pQVar6 != (QPainter *)0x0)) &&
           (uVar4 = QPainter::isActive(), (uVar4 & 1) != 0)) {
          setSharedPainter(in_stack_fffffffffffffef0,(QPainter *)in_stack_fffffffffffffee8);
        }
      }
      local_44 = *in_RDX;
      local_5c = QRegion::boundingRect();
      local_4c = QRect::topLeft(in_stack_fffffffffffffed8);
      QPoint::operator-=(in_stack_fffffffffffffee0,(QPoint *)in_stack_fffffffffffffed8);
      local_64 = &DAT_aaaaaaaaaaaaaaaa;
      QPoint::QPoint(in_stack_fffffffffffffee0);
      local_d8 = (QWidgetPrivate *)0x0;
      iVar2 = (**(code **)(*(long *)in_RSI + 0x10))();
      if (iVar2 == 1) {
        if (in_RSI == (QWidgetPrivate *)0x0) {
          in_stack_fffffffffffffee8 = (QPoint *)0x0;
        }
        else {
          in_stack_fffffffffffffee8 = (QPoint *)(in_RSI[-1].high_attributes + 2);
        }
        in_stack_fffffffffffffef0 = in_RSI;
        QWidget::d_func((QWidget *)0x36f2ff);
        local_d8 = (QWidgetPrivate *)
                   QWidgetPrivate::redirected(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      }
      local_a0 = in_RSI;
      if (local_d8 != (QWidgetPrivate *)0x0) {
        local_a0 = local_d8;
        QPoint::operator-=(in_stack_fffffffffffffee0,(QPoint *)in_stack_fffffffffffffed8);
      }
      other = (RenderFlag)((ulong)in_stack_fffffffffffffed8 >> 0x20);
      if ((uVar8 & 0x1000000) == 0) {
        lVar7 = (**(code **)(*(long *)local_a0 + 0x18))();
        if (lVar7 != 0) {
          local_70.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
          QPaintEngine::systemClip();
          uVar4 = QRegion::isEmpty();
          if ((uVar4 & 1) == 0) {
            local_80 = ::operator-(in_stack_fffffffffffffee0);
            QRegion::translated((QRegion *)in_stack_fffffffffffffef8,
                                (QPoint *)in_stack_fffffffffffffef0);
            QRegion::operator&=(&local_38,(QRegion *)local_78);
            QRegion::~QRegion((QRegion *)local_78);
          }
          QRegion::~QRegion(&local_70);
        }
      }
      local_84.i = 0xaaaaaaaa;
      local_84.i = (Int)::operator|((enum_type)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                                    (enum_type)in_stack_fffffffffffffee0);
      local_88.super_QFlagsStorage<QWidget::RenderFlag>.i =
           (QFlagsStorage<QWidget::RenderFlag>)
           QFlags<QWidget::RenderFlag>::operator&
                     ((QFlags<QWidget::RenderFlag> *)in_stack_fffffffffffffee0,other);
      IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_88);
      if (IVar3 != 0) {
        QFlags<QWidgetPrivate::DrawWidgetFlag>::operator|=
                  ((QFlags<QWidgetPrivate::DrawWidgetFlag> *)&local_84,DrawAsRoot);
      }
      local_8c.super_QFlagsStorage<QWidget::RenderFlag>.i =
           (QFlagsStorage<QWidget::RenderFlag>)
           QFlags<QWidget::RenderFlag>::operator&
                     ((QFlags<QWidget::RenderFlag> *)in_stack_fffffffffffffee0,other);
      IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_8c);
      if (IVar3 == 0) {
        QFlags<QWidgetPrivate::DrawWidgetFlag>::operator|=
                  ((QFlags<QWidgetPrivate::DrawWidgetFlag> *)&local_84,DontSubtractOpaqueChildren);
      }
      else {
        QFlags<QWidgetPrivate::DrawWidgetFlag>::operator|=
                  ((QFlags<QWidgetPrivate::DrawWidgetFlag> *)&local_84,DrawRecursive);
      }
      QFlags<QWidgetPrivate::DrawWidgetFlag>::operator|=
                ((QFlags<QWidgetPrivate::DrawWidgetFlag> *)&local_84,DontSetCompositionMode);
      sharedPainter(in_stack_fffffffffffffef0);
      drawWidget(in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018,
                 (DrawWidgetFlags)in_stack_0000029c.i,in_stack_00000010,in_stack_000002d0);
      if (local_f8 != (QPainter *)0x0) {
        setSharedPainter(in_stack_fffffffffffffef0,(QPainter *)in_stack_fffffffffffffee8);
      }
    }
    QRegion::~QRegion(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::render(QPaintDevice *target, const QPoint &targetOffset,
                            const QRegion &sourceRegion, QWidget::RenderFlags renderFlags)
{
    if (Q_UNLIKELY(!target)) {
        qWarning("QWidget::render: null pointer to paint device");
        return;
    }

    const bool inRenderWithPainter = extra && extra->inRenderWithPainter;
    QRegion paintRegion = !inRenderWithPainter
                          ? prepareToRender(sourceRegion, renderFlags)
                          : sourceRegion;
    if (paintRegion.isEmpty())
        return;

    QPainter *oldSharedPainter = inRenderWithPainter ? sharedPainter() : nullptr;

    // Use the target's shared painter if set (typically set when doing
    // "other->render(widget);" in the widget's paintEvent.
    if (target->devType() == QInternal::Widget) {
        QWidgetPrivate *targetPrivate = static_cast<QWidget *>(target)->d_func();
        if (targetPrivate->extra && targetPrivate->extra->inRenderWithPainter) {
            QPainter *targetPainter = targetPrivate->sharedPainter();
            if (targetPainter && targetPainter->isActive())
                setSharedPainter(targetPainter);
        }
    }

    // Use the target's redirected device if set and adjust offset and paint
    // region accordingly. This is typically the case when people call render
    // from the paintEvent.
    QPoint offset = targetOffset;
    offset -= paintRegion.boundingRect().topLeft();
    QPoint redirectionOffset;
    QPaintDevice *redirected = nullptr;

    if (target->devType() == QInternal::Widget)
        redirected = static_cast<QWidget *>(target)->d_func()->redirected(&redirectionOffset);

    if (redirected) {
        target = redirected;
        offset -= redirectionOffset;
    }

    if (!inRenderWithPainter) { // Clip handled by shared painter (in qpainter.cpp).
        if (QPaintEngine *targetEngine = target->paintEngine()) {
            const QRegion targetSystemClip = targetEngine->systemClip();
            if (!targetSystemClip.isEmpty())
                paintRegion &= targetSystemClip.translated(-offset);
        }
    }

    // Set backingstore flags.
    DrawWidgetFlags flags = DrawPaintOnScreen | DrawInvisible;
    if (renderFlags & QWidget::DrawWindowBackground)
        flags |= DrawAsRoot;

    if (renderFlags & QWidget::DrawChildren)
        flags |= DrawRecursive;
    else
        flags |= DontSubtractOpaqueChildren;

    flags |= DontSetCompositionMode;

    // Render via backingstore.
    drawWidget(target, paintRegion, offset, flags, sharedPainter());

    // Restore shared painter.
    if (oldSharedPainter)
        setSharedPainter(oldSharedPainter);
}